

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa.c
# Opt level: O3

exr_result_t internal_exr_apply_dwaa(exr_encode_pipeline_t *encode)

{
  exr_result_t eVar1;
  uint64_t newsz;
  exr_decode_pipeline_t *decode;
  DwaCompressor dwaa;
  DwaCompressor DStack_d8;
  
  decode = (exr_decode_pipeline_t *)&encode->scratch_alloc_size_1;
  newsz = internal_exr_huf_compress_spare_bytes();
  eVar1 = internal_encode_alloc_buffer
                    (encode,EXR_TRANSCODE_BUFFER_SCRATCH1,&encode->scratch_buffer_1,(size_t *)decode
                     ,newsz);
  if (eVar1 == 0) {
    eVar1 = DwaCompressor_construct
                      (&DStack_d8,(AcCompression)encode,(exr_encode_pipeline_t *)0x0,decode);
    if (eVar1 == 0) {
      eVar1 = DwaCompressor_compress(&DStack_d8);
    }
    DwaCompressor_destroy(&DStack_d8);
  }
  return eVar1;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

exr_result_t
internal_exr_apply_dwaa (exr_encode_pipeline_t* encode)
{
    exr_result_t  rv;
    DwaCompressor dwaa;
    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        internal_exr_huf_compress_spare_bytes ());
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = DwaCompressor_construct (&dwaa, STATIC_HUFFMAN, encode, NULL);
        if (rv == EXR_ERR_SUCCESS) rv = DwaCompressor_compress (&dwaa);

        DwaCompressor_destroy (&dwaa);
    }

    return rv;
}